

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward(ggml_compute_params *params,ggml_tensor *tensor)

{
  int32_t iVar1;
  ggml_tensor *src1;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  _Bool masked;
  ggml_compute_params *in_stack_00000010;
  int32_t t;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RDI == (ggml_tensor *)0x0) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2176,
            "params");
    abort();
  }
  src1 = (ggml_tensor *)(ulong)in_RSI->op;
  switch(src1) {
  case (ggml_tensor *)0x0:
    break;
  case (ggml_tensor *)0x1:
    ggml_compute_forward_dup
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x2:
    ggml_compute_forward_add
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x3:
    ggml_compute_forward_sub
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x4:
    ggml_compute_forward_mul
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x5:
    ggml_compute_forward_div
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x6:
    ggml_compute_forward_sqr
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x7:
    ggml_compute_forward_sqrt
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x8:
    ggml_compute_forward_sum
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x9:
    ggml_compute_forward_mean
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xa:
    ggml_compute_forward_repeat
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xb:
    ggml_compute_forward_abs
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xc:
    ggml_compute_forward_sgn
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xd:
    ggml_compute_forward_neg
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xe:
    ggml_compute_forward_step
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0xf:
    ggml_compute_forward_relu
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x10:
    ggml_compute_forward_gelu
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x11:
    ggml_compute_forward_silu
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x12:
    ggml_compute_forward_norm
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x13:
    ggml_compute_forward_rms_norm
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x14:
    ggml_compute_forward_mul_mat
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x15:
    ggml_compute_forward_scale
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x16:
    ggml_compute_forward_cpy
              ((ggml_compute_params *)src1,in_stack_ffffffffffffffd8,(ggml_tensor *)0x150e83);
    break;
  case (ggml_tensor *)0x17:
    ggml_compute_forward_reshape((ggml_compute_params *)in_RDI,in_RSI->src0,in_RSI);
    break;
  case (ggml_tensor *)0x18:
    ggml_compute_forward_view((ggml_compute_params *)in_RDI,in_RSI->src0);
    break;
  case (ggml_tensor *)0x19:
    ggml_compute_forward_permute((ggml_compute_params *)in_RDI,in_RSI->src0);
    break;
  case (ggml_tensor *)0x1a:
    ggml_compute_forward_transpose((ggml_compute_params *)in_RDI,in_RSI->src0);
    break;
  case (ggml_tensor *)0x1b:
    ggml_compute_forward_get_rows
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x1c:
    ggml_compute_forward_diag_mask_inf
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x1d:
    ggml_compute_forward_soft_max
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1);
    break;
  case (ggml_tensor *)0x1e:
    ggml_compute_forward_rope
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x1f:
    ggml_compute_forward_conv_1d_1s
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x20:
    ggml_compute_forward_conv_1d_2s
              ((ggml_compute_params *)in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),src1,
               in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x21:
    iVar1 = ggml_get_i32_1d((ggml_tensor *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    if ((iVar1 != 0) && (iVar1 != 1)) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x21fc,"t == 0 || t == 1");
      abort();
    }
    ggml_compute_forward_flash_attn
              ((ggml_compute_params *)unaff_retaddr,in_RDI,in_RSI,
               (ggml_tensor *)CONCAT44(iVar1,CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffe8)),
               SUB81((ulong)src1 >> 0x38,0),in_stack_ffffffffffffffd8);
    break;
  case (ggml_tensor *)0x22:
    ggml_compute_forward_flash_ff
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,
               (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (ggml_tensor *)params);
    break;
  case (ggml_tensor *)0x23:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x220a,
            "false");
    abort();
  }
  return;
}

Assistant:

static void ggml_compute_forward(struct ggml_compute_params * params, struct ggml_tensor * tensor) {
    GGML_ASSERT(params);

    switch (tensor->op) {
        case GGML_OP_DUP:
            {
                ggml_compute_forward_dup(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ADD:
            {
                ggml_compute_forward_add(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SUB:
            {
                ggml_compute_forward_sub(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_MUL:
            {
                ggml_compute_forward_mul(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIV:
            {
                ggml_compute_forward_div(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SQR:
            {
                ggml_compute_forward_sqr(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SQRT:
            {
                ggml_compute_forward_sqrt(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SUM:
            {
                ggml_compute_forward_sum(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MEAN:
            {
                ggml_compute_forward_mean(params, tensor->src0, tensor);
            } break;
        case GGML_OP_REPEAT:
            {
                ggml_compute_forward_repeat(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ABS:
            {
                ggml_compute_forward_abs(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SGN:
            {
                ggml_compute_forward_sgn(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NEG:
            {
                ggml_compute_forward_neg(params, tensor->src0, tensor);
            } break;
        case GGML_OP_STEP:
            {
                ggml_compute_forward_step(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RELU:
            {
                ggml_compute_forward_relu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_GELU:
            {
                ggml_compute_forward_gelu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SILU:
            {
                ggml_compute_forward_silu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NORM:
            {
                ggml_compute_forward_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RMS_NORM:
            {
                ggml_compute_forward_rms_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MUL_MAT:
            {
                ggml_compute_forward_mul_mat(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SCALE:
            {
                ggml_compute_forward_scale(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CPY:
            {
                ggml_compute_forward_cpy(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RESHAPE:
            {
                ggml_compute_forward_reshape(params, tensor->src0, tensor);
            } break;
        case GGML_OP_VIEW:
            {
                ggml_compute_forward_view(params, tensor->src0);
            } break;
        case GGML_OP_PERMUTE:
            {
                ggml_compute_forward_permute(params, tensor->src0);
            } break;
        case GGML_OP_TRANSPOSE:
            {
                ggml_compute_forward_transpose(params, tensor->src0);
            } break;
        case GGML_OP_GET_ROWS:
            {
                ggml_compute_forward_get_rows(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIAG_MASK_INF:
            {
                ggml_compute_forward_diag_mask_inf(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SOFT_MAX:
            {
                ggml_compute_forward_soft_max(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ROPE:
            {
                ggml_compute_forward_rope(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_1S:
            {
                ggml_compute_forward_conv_1d_1s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_2S:
            {
                ggml_compute_forward_conv_1d_2s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_FLASH_ATTN:
            {
                int32_t t = ggml_get_i32_1d(tensor->opt[1], 0);
                GGML_ASSERT(t == 0 || t == 1);
                bool masked = t != 0;
                ggml_compute_forward_flash_attn(params, tensor->src0, tensor->src1, tensor->opt[0], masked, tensor);
            } break;
        case GGML_OP_FLASH_FF:
            {
                ggml_compute_forward_flash_ff(params, tensor->src0, tensor->src1, tensor->opt[0], tensor->opt[1], tensor->opt[2], tensor);
            } break;
        case GGML_OP_NONE:
            {
                // nop
            } break;
        case GGML_OP_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}